

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

bool __thiscall ON_Matrix::Add(ON_Matrix *this,ON_Matrix *a,ON_Matrix *b)

{
  int col_count;
  uint uVar1;
  uint uVar2;
  double **ppdVar3;
  double **ppdVar4;
  double **ppdVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  bool bVar9;
  int iVar10;
  double ***pppdVar11;
  int row_count;
  double ***pppdVar12;
  double ***pppdVar13;
  ulong uVar14;
  ulong uVar15;
  
  col_count = a->m_col_count;
  if (col_count == b->m_col_count) {
    bVar9 = false;
    if (((0 < col_count) && (row_count = a->m_row_count, bVar9 = false, 0 < row_count)) &&
       (bVar9 = false, row_count == b->m_row_count)) {
      iVar10 = row_count;
      if (this != b && this != a) {
        Create(this,row_count,col_count);
        row_count = b->m_row_count;
        iVar10 = a->m_row_count;
      }
      pppdVar11 = &a->m;
      if (iVar10 == (a->m_rowmem).m_count) {
        pppdVar11 = &(a->m_rowmem).m_a;
      }
      pppdVar12 = &b->m;
      if (row_count == (b->m_rowmem).m_count) {
        pppdVar12 = &(b->m_rowmem).m_a;
      }
      uVar1 = this->m_row_count;
      pppdVar13 = &this->m;
      if (uVar1 == (this->m_rowmem).m_count) {
        pppdVar13 = &(this->m_rowmem).m_a;
      }
      bVar9 = true;
      if (0 < (int)uVar1) {
        ppdVar3 = *pppdVar11;
        ppdVar4 = *pppdVar12;
        ppdVar5 = *pppdVar13;
        uVar2 = this->m_col_count;
        uVar14 = 0;
        do {
          if (0 < (int)uVar2) {
            pdVar6 = ppdVar3[uVar14];
            pdVar7 = ppdVar4[uVar14];
            pdVar8 = ppdVar5[uVar14];
            uVar15 = 0;
            do {
              pdVar8[uVar15] = pdVar6[uVar15] + pdVar7[uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 != uVar1);
      }
    }
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool ON_Matrix::Add( const ON_Matrix& a, const ON_Matrix& b )
{
  int i, j;
  if (a.ColCount() != b.ColCount() )
    return false;
  if (a.RowCount() != b.RowCount() )
    return false;
  if ( a.RowCount() < 1 || a.ColCount() < 1 )
    return false;
  if ( this != &a && this != &b ) {
    Create( a.RowCount(), b.ColCount() );
  }
  double const*const* am = a.ThisM();
  double const*const* bm = b.ThisM();
  double** this_m = ThisM();
  for ( i = 0; i < m_row_count; i++ ) for ( j = 0; j < m_col_count; j++ ) {
    this_m[i][j] = am[i][j] + bm[i][j];
  }
  return true;  
}